

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O2

int TestReintersectConvex(ShapeHandle *shape,RNG *rng)

{
  ShapeIntersection *this;
  byte bVar1;
  bool bVar2;
  Float *pFVar3;
  Tuple3<pbrt::Point3,_float> *pTVar4;
  Point3f *pPVar5;
  int c;
  int iVar6;
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  *this_00;
  int c_2;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [60];
  undefined1 auVar18 [56];
  undefined1 extraout_var_00 [60];
  undefined1 auVar10 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar11 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var_01 [60];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar19 [16];
  Point3<float> PVar20;
  Vector3<float> VVar21;
  Vector3f VVar22;
  Point3f PVar23;
  Point2f u;
  Bounds3f bbox;
  optional<pbrt::ShapeIntersection> si;
  Tuple3<pbrt::Vector3,_float> local_318;
  undefined1 local_308 [8];
  undefined1 local_300 [16];
  ShapeIntersection *local_2f0;
  Tuple2<pbrt::Point2,_float> local_2e8;
  int local_2dc;
  int local_2d8;
  Float local_2d4;
  Float local_2d0;
  Float local_2cc;
  Normal3f *local_2c8;
  Tuple3<pbrt::Point3,_float> local_2c0;
  Ray local_2b0;
  anon_struct_8_0_00000001_for___align local_288;
  float fStack_274;
  Float FStack_270;
  MediumHandle local_268;
  Bounds3<float> local_258;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_240;
  byte local_140;
  optional<pbrt::ShapeIntersection> local_138;
  undefined8 uVar17;
  
  local_2cc = 0.0;
  local_2d0 = 0.0;
  local_2d4 = 0.0;
  local_300._8_8_ = shape;
  for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
    in_ZMM0._0_4_ = pExp(rng,8.0);
    in_ZMM0._4_60_ = extraout_var;
    pFVar3 = &local_2cc;
    if ((iVar6 != 0) && (pFVar3 = &local_2d4, iVar6 == 1)) {
      pFVar3 = &local_2d0;
    }
    *pFVar3 = in_ZMM0._0_4_;
  }
  pbrt::
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::Bounds()const::_lambda(auto:1)_1_>
            (&local_258,
             (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
              *)local_300._8_8_);
  local_2c0.x = 0.0;
  local_2c0.y = 0.0;
  local_2c0.z = 0.0;
  for (iVar6 = 0; auVar18 = in_ZMM0._8_56_, iVar6 != 3; iVar6 = iVar6 + 1) {
    in_ZMM0._0_4_ = pbrt::RNG::Uniform<float>(rng);
    in_ZMM0._4_60_ = extraout_var_00;
    pTVar4 = &local_2c0;
    if ((iVar6 != 0) && (pTVar4 = (Tuple3<pbrt::Point3,_float> *)&local_2c0.y, iVar6 != 1)) {
      pTVar4 = (Tuple3<pbrt::Point3,_float> *)&local_2c0.z;
    }
    pTVar4->x = in_ZMM0._0_4_;
  }
  PVar20 = pbrt::Bounds3<float>::Lerp(&local_258,(Point3f *)&local_2c0);
  auVar10._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar18;
  auVar9 = vinsertps_avx(ZEXT416((uint)local_2cc),ZEXT416((uint)local_2d0),0x10);
  local_2b0.d.super_Tuple3<pbrt::Vector3,_float>.z =
       PVar20.super_Tuple3<pbrt::Point3,_float>.z - local_2d4;
  local_2b0.o.super_Tuple3<pbrt::Point3,_float>.x = local_2cc;
  local_2b0.o.super_Tuple3<pbrt::Point3,_float>.y = local_2d0;
  local_2b0.o.super_Tuple3<pbrt::Point3,_float>.z = local_2d4;
  auVar9 = vsubps_avx(auVar10._0_16_,auVar9);
  local_2b0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar9);
  local_2b0.time = 0.0;
  local_2b0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  fVar8 = pbrt::RNG::Uniform<float>(rng);
  if (fVar8 < 0.5) {
    auVar18 = extraout_var_02;
    VVar21 = pbrt::Normalize<float>(&local_2b0.d);
    local_2b0.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar18;
    local_2b0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar11._0_16_);
  }
  this_00 = (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
             *)local_300._8_8_;
  pbrt::ShapeHandle::Intersect(&local_138,(ShapeHandle *)local_300._8_8_,&local_2b0,INFINITY);
  iVar6 = 0;
  if (local_138.set == true) {
    local_2f0 = pstd::optional<pbrt::ShapeIntersection>::value(&local_138);
    local_2c8 = &(local_2f0->intr).super_Interaction.n;
    iVar6 = 0;
    iVar7 = 0;
    while (iVar7 != 1000) {
      local_2e8.x = 0.0;
      local_2e8.y = 0.0;
      fVar8 = pbrt::RNG::Uniform<float>(rng);
      local_2e8.x = fVar8;
      fVar8 = pbrt::RNG::Uniform<float>(rng);
      local_2e8.y = fVar8;
      auVar18 = extraout_var_03;
      VVar22 = pbrt::SampleUniformSphere((Point2f *)&local_2e8);
      local_318.z = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar18;
      local_318._0_8_ = vmovlps_avx(auVar12._0_16_);
      VVar21 = pbrt::FaceForward<float>((Vector3<float> *)&local_318,local_2c8);
      local_318.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar18;
      local_318._0_8_ = vmovlps_avx(auVar13._0_16_);
      local_2d8 = iVar7;
      pbrt::Interaction::SpawnRay
                ((RayDifferential *)&local_240.__align,(Interaction *)local_2f0,
                 (Vector3f *)&local_318);
      fStack_274 = (float)local_240._20_4_;
      FStack_270 = (Float)local_240._24_4_;
      local_288 = local_240.__align;
      local_268.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_240._32_8_;
      bVar2 = pbrt::ShapeHandle::IntersectP((ShapeHandle *)this_00,(Ray *)&local_288,INFINITY);
      auVar14 = ZEXT464(0x7f800000);
      pbrt::ShapeHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align,(ShapeHandle *)this_00,
                 (Ray *)&local_288,INFINITY);
      bVar1 = local_140;
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align);
      local_308 = (undefined1  [8])0x0;
      local_300._0_4_ = 0.0;
      local_2dc = iVar6 + (uint)bVar1 + (uint)bVar2;
      for (iVar6 = 0; auVar18 = auVar14._8_56_, iVar6 != 3; iVar6 = iVar6 + 1) {
        auVar14._0_4_ = pExp(rng,8.0);
        auVar14._4_60_ = extraout_var_01;
        pPVar5 = (Point3f *)local_308;
        if ((iVar6 != 0) && (pPVar5 = (Point3f *)(local_308 + 4), iVar6 != 1)) {
          pPVar5 = (Point3f *)local_300;
        }
        (pPVar5->super_Tuple3<pbrt::Point3,_float>).x = auVar14._0_4_;
      }
      PVar23 = pbrt::Interaction::p((Interaction *)local_2f0);
      this_00 = (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
                 *)local_300._8_8_;
      auVar15._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar15._8_56_ = auVar18;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_308;
      auVar9 = vsubps_avx(auVar19,auVar15._0_16_);
      auVar18 = ZEXT856(auVar9._8_8_);
      local_318.z = (float)local_300._0_4_ - PVar23.super_Tuple3<pbrt::Point3,_float>.z;
      local_318._0_8_ = vmovlps_avx(auVar9);
      VVar21 = pbrt::FaceForward<float>((Vector3<float> *)&local_318,local_2c8);
      this = local_2f0;
      uVar17 = auVar18._0_8_;
      local_318.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar16._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar18;
      local_318._0_8_ = vmovlps_avx(auVar16._0_16_);
      PVar23 = pbrt::Interaction::p((Interaction *)local_2f0);
      local_300._0_4_ = PVar23.super_Tuple3<pbrt::Point3,_float>.z + local_318.z;
      auVar9._0_4_ = PVar23.super_Tuple3<pbrt::Point3,_float>.x + local_318.x;
      auVar9._4_4_ = PVar23.super_Tuple3<pbrt::Point3,_float>.y + local_318.y;
      auVar9._8_4_ = (float)uVar17 + 0.0;
      auVar9._12_4_ = (float)((ulong)uVar17 >> 0x20) + 0.0;
      local_308 = (undefined1  [8])vmovlps_avx(auVar9);
      pbrt::Interaction::SpawnRayTo
                ((Ray *)&local_240.__align,(Interaction *)this,(Point3f *)local_308);
      fStack_274 = (float)local_240._20_4_;
      FStack_270 = (Float)local_240._24_4_;
      local_288 = local_240.__align;
      local_268.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_240._32_8_;
      bVar2 = pbrt::ShapeHandle::IntersectP((ShapeHandle *)this_00,(Ray *)&local_288,1.0);
      pbrt::ShapeHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align,(ShapeHandle *)this_00,
                 (Ray *)&local_288,1.0);
      iVar6 = local_2dc + (uint)local_140 + (uint)bVar2;
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)&local_240.__align);
      iVar7 = local_2d8 + 1;
    }
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&local_138);
  return iVar6;
}

Assistant:

static int TestReintersectConvex(ShapeHandle shape, RNG &rng) {
    // Ray origin
    Point3f o;
    for (int c = 0; c < 3; ++c)
        o[c] = pExp(rng);

    // Destination: a random point in the shape's bounding box.
    Bounds3f bbox = shape.Bounds();
    Point3f t;
    for (int c = 0; c < 3; ++c)
        t[c] = rng.Uniform<Float>();
    Point3f p2 = bbox.Lerp(t);

    // Ray to intersect with the shape.
    Ray r(o, p2 - o);
    if (rng.Uniform<Float>() < .5)
        r.d = Normalize(r.d);

    // We should usually (but not always) find an intersection.
    auto si = shape.Intersect(r);
    if (!si)
        return 0;
    SurfaceInteraction &isect = si->intr;

    // Now trace a bunch of rays leaving the intersection point.
    int n = 0;
    for (int j = 0; j < 1000; ++j) {
        // Random direction leaving the intersection point.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Vector3f w = SampleUniformSphere(u);
        // Make sure it's in the same hemisphere as the surface normal.
        w = FaceForward(w, isect.n);
        Ray rOut = isect.SpawnRay(w);

        if (shape.IntersectP(rOut))
            ++n;
        if (shape.Intersect(rOut).has_value())
            ++n;

        // Choose a random point to trace rays to.
        Point3f p2;
        for (int c = 0; c < 3; ++c)
            p2[c] = pExp(rng);
        // Make sure that the point we're tracing rays toward is in the
        // hemisphere about the intersection point's surface normal.
        w = p2 - isect.p();
        w = FaceForward(w, isect.n);
        p2 = isect.p() + w;
        rOut = isect.SpawnRayTo(p2);

        if (shape.IntersectP(rOut, 1))
            ++n;
        if (shape.Intersect(rOut, 1).has_value())
            ++n;
    }

    return n;
}